

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

WebPEncodingError AllocateTransformBuffer(VP8LEncoder *enc,int width,int height)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint32_t *puVar4;
  long lVar5;
  ulong nmemb;
  
  if (enc->use_predict_ == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = ((long)(width * 2) + 3U >> 2) + (long)(width * 2 + 2);
  }
  if ((enc->use_predict_ == 0) && (enc->use_cross_color_ == 0)) {
    uVar3 = 0;
  }
  else {
    bVar1 = (byte)enc->transform_bits_;
    iVar2 = 1 << (bVar1 & 0x1f);
    uVar3 = ((iVar2 + height) - 1U >> (bVar1 & 0x1f)) * ((width + iVar2) - 1U >> (bVar1 & 0x1f));
  }
  nmemb = (ulong)uVar3 + lVar5 + height * width + 0x10;
  puVar4 = enc->transform_mem_;
  if ((puVar4 == (uint32_t *)0x0) || (enc->transform_mem_size_ < nmemb)) {
    WebPSafeFree(puVar4);
    enc->transform_mem_ = (uint32_t *)0x0;
    enc->transform_mem_size_ = 0;
    puVar4 = (uint32_t *)WebPSafeMalloc(nmemb,4);
    if (puVar4 == (uint32_t *)0x0) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    enc->transform_mem_ = puVar4;
    enc->transform_mem_size_ = nmemb;
    enc->argb_content_ = kEncoderNone;
  }
  enc->argb_ = puVar4;
  puVar4 = (uint32_t *)((long)puVar4 + (long)(height * width) * 4 + 0x1f & 0xffffffffffffffe0);
  enc->argb_scratch_ = puVar4;
  enc->transform_data_ = (uint32_t *)((long)puVar4 + lVar5 * 4 + 0x1f & 0xffffffffffffffe0);
  enc->current_width_ = width;
  return VP8_ENC_OK;
}

Assistant:

static WebPEncodingError AllocateTransformBuffer(VP8LEncoder* const enc,
                                                 int width, int height) {
  WebPEncodingError err = VP8_ENC_OK;
  const uint64_t image_size = width * height;
  // VP8LResidualImage needs room for 2 scanlines of uint32 pixels with an extra
  // pixel in each, plus 2 regular scanlines of bytes.
  // TODO(skal): Clean up by using arithmetic in bytes instead of words.
  const uint64_t argb_scratch_size =
      enc->use_predict_
          ? (width + 1) * 2 +
            (width * 2 + sizeof(uint32_t) - 1) / sizeof(uint32_t)
          : 0;
  const uint64_t transform_data_size =
      (enc->use_predict_ || enc->use_cross_color_)
          ? VP8LSubSampleSize(width, enc->transform_bits_) *
                VP8LSubSampleSize(height, enc->transform_bits_)
          : 0;
  const uint64_t max_alignment_in_words =
      (WEBP_ALIGN_CST + sizeof(uint32_t) - 1) / sizeof(uint32_t);
  const uint64_t mem_size =
      image_size + max_alignment_in_words +
      argb_scratch_size + max_alignment_in_words +
      transform_data_size;
  uint32_t* mem = enc->transform_mem_;
  if (mem == NULL || mem_size > enc->transform_mem_size_) {
    ClearTransformBuffer(enc);
    mem = (uint32_t*)WebPSafeMalloc(mem_size, sizeof(*mem));
    if (mem == NULL) {
      err = VP8_ENC_ERROR_OUT_OF_MEMORY;
      goto Error;
    }
    enc->transform_mem_ = mem;
    enc->transform_mem_size_ = (size_t)mem_size;
    enc->argb_content_ = kEncoderNone;
  }
  enc->argb_ = mem;
  mem = (uint32_t*)WEBP_ALIGN(mem + image_size);
  enc->argb_scratch_ = mem;
  mem = (uint32_t*)WEBP_ALIGN(mem + argb_scratch_size);
  enc->transform_data_ = mem;

  enc->current_width_ = width;
 Error:
  return err;
}